

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dSFMT.c
# Opt level: O3

void dsfmt_gen_rand_all(dsfmt_t *dsfmt)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint64_t t1;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  auVar1 = *(undefined1 (*) [16])dsfmt->status[0].u;
  auVar10._0_8_ = auVar1._0_8_ << 0x13;
  auVar10._8_8_ = auVar1._8_8_ << 0x13;
  auVar8._4_4_ = *(undefined4 *)((long)dsfmt->status + 0xbf8);
  auVar8._0_4_ = *(undefined4 *)((long)dsfmt->status + 0xbfc);
  auVar8._8_4_ = *(undefined4 *)((long)dsfmt->status + 0xbf4);
  auVar8._12_4_ = dsfmt->status[0xbf].u32[0];
  auVar8 = auVar8 ^ auVar10 ^ (undefined1  [16])dsfmt->status[0x75];
  uVar6 = auVar8._8_8_;
  auVar9._0_8_ = auVar8._0_8_ >> 0xc;
  auVar9._8_8_ = uVar6 >> 0xc;
  dsfmt->status[0] = (w128_t)(auVar9 ^ auVar1 ^ _DAT_00132010 & auVar8);
  lVar7 = 0;
  uVar3 = auVar8._0_8_;
  do {
    uVar2 = *(ulong *)((long)dsfmt->status + lVar7 + 0x10);
    uVar5 = *(ulong *)((long)dsfmt->status + lVar7 + 0x18);
    uVar4 = (uVar6 << 0x20 | uVar6 >> 0x20) ^ uVar2 << 0x13 ^
            *(ulong *)((long)dsfmt->status + lVar7 + 0x760);
    uVar6 = (uVar3 << 0x20 | uVar3 >> 0x20) ^ uVar5 << 0x13 ^
            *(ulong *)((long)dsfmt->status + lVar7 + 0x768);
    *(ulong *)((long)dsfmt->status + lVar7 + 0x10) = uVar4 & 0xffafffffffb3f ^ uVar4 >> 0xc ^ uVar2;
    *(ulong *)((long)dsfmt->status + lVar7 + 0x18) = uVar6 & 0xffdfffc90fffd ^ uVar6 >> 0xc ^ uVar5;
    lVar7 = lVar7 + 0x10;
    uVar3 = uVar4;
  } while (lVar7 != 0x490);
  lVar7 = 0;
  do {
    uVar3 = *(ulong *)((long)dsfmt->status + lVar7 + 0x4a0);
    uVar2 = *(ulong *)((long)dsfmt->status + lVar7 + 0x4a8);
    uVar5 = (uVar6 << 0x20 | uVar6 >> 0x20) ^ uVar3 << 0x13 ^
            *(ulong *)((long)dsfmt->status + lVar7);
    uVar6 = (uVar4 << 0x20 | uVar4 >> 0x20) ^ uVar2 << 0x13 ^
            *(ulong *)((long)dsfmt->status + lVar7 + 8);
    *(ulong *)((long)dsfmt->status + lVar7 + 0x4a0) = uVar5 & 0xffafffffffb3f ^ uVar5 >> 0xc ^ uVar3
    ;
    *(ulong *)((long)dsfmt->status + lVar7 + 0x4a8) = uVar6 & 0xffdfffc90fffd ^ uVar6 >> 0xc ^ uVar2
    ;
    lVar7 = lVar7 + 0x10;
    uVar4 = uVar5;
  } while (lVar7 != 0x750);
  dsfmt->status[0xbf].u[0] = uVar5;
  *(ulong *)((long)dsfmt->status + 0xbf8) = uVar6;
  return;
}

Assistant:

void dsfmt_gen_rand_all(dsfmt_t* dsfmt)
{
	int i;
	w128_t lung;

	lung = dsfmt->status[DSFMT_N];
	do_recursion(&dsfmt->status[0], &dsfmt->status[0],
	             &dsfmt->status[DSFMT_POS1], &lung);
	for (i = 1; i < DSFMT_N - DSFMT_POS1; i++)
	{
		do_recursion(&dsfmt->status[i], &dsfmt->status[i],
		             &dsfmt->status[i + DSFMT_POS1], &lung);
	}
	for (; i < DSFMT_N; i++)
	{
		do_recursion(&dsfmt->status[i], &dsfmt->status[i],
		             &dsfmt->status[i + DSFMT_POS1 - DSFMT_N], &lung);
	}
	dsfmt->status[DSFMT_N] = lung;
}